

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_query.cpp
# Opt level: O2

void __thiscall
HtmlFormParser_one_key_Test::~HtmlFormParser_one_key_Test(HtmlFormParser_one_key_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HtmlFormParser, one_key) {
	std::vector<std::pair<std::u8string_view, std::u8string_view>> parsed_result;
	std::u8string query_text = u8"key";
	EXPECT_TRUE(jessilib::deserialize_html_form(parsed_result, query_text));
	EXPECT_EQ(query_text, u8"key");
	EXPECT_EQ(parsed_result.size(), 1);
	EXPECT_EQ(parsed_result[0].first, query_text);
	EXPECT_TRUE(parsed_result[0].second.empty());
}